

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pss)

{
  ZSTD_compressionParameters cParams;
  undefined8 *puVar1;
  uint uVar2;
  ZSTD_CCtx_params *cctxParams;
  unsigned_long_long in_RCX;
  ZSTD_CCtx *in_RDI;
  int in_stack_00000024;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  U64 pledgedSrcSize;
  ZSTD_CCtx *in_stack_ffffffffffffff78;
  void *dict_00;
  ZSTD_CCtx *cctx;
  undefined1 in_stack_ffffffffffffff94 [12];
  unsigned_long_long uVar3;
  ZSTD_strategy ZVar4;
  undefined4 uStack_54;
  ZSTD_CCtx_params *local_8;
  
  ZVar4 = (ZSTD_strategy)&stack0x00000008;
  uStack_54 = (undefined4)((ulong)&stack0x00000008 >> 0x20);
  if ((in_RCX == 0) && (in_stack_00000024 == 0)) {
    in_RCX = 0xffffffffffffffff;
  }
  uVar3 = in_RCX;
  local_8 = (ZSTD_CCtx_params *)ZSTD_CCtx_reset(in_stack_ffffffffffffff78,0);
  uVar2 = ERR_isError((size_t)local_8);
  if (uVar2 == 0) {
    cctxParams = (ZSTD_CCtx_params *)ZSTD_CCtx_setPledgedSrcSize(in_RDI,in_RCX);
    uVar2 = ERR_isError((size_t)cctxParams);
    local_8 = cctxParams;
    if (uVar2 == 0) {
      puVar1 = (undefined8 *)CONCAT44(uStack_54,ZVar4);
      dict_00 = (void *)*puVar1;
      cctx = (ZSTD_CCtx *)puVar1[1];
      cParams.chainLog = in_stack_ffffffffffffff94._0_4_;
      cParams.hashLog = in_stack_ffffffffffffff94._4_4_;
      cParams.searchLog = in_stack_ffffffffffffff94._8_4_;
      cParams.windowLog = *(undefined4 *)(puVar1 + 3);
      cParams.minMatch = (int)uVar3;
      cParams.targetLength = (int)(uVar3 >> 0x20);
      cParams.strategy = ZVar4;
      local_8 = (ZSTD_CCtx_params *)ZSTD_checkCParams(cParams);
      uVar2 = ERR_isError((size_t)local_8);
      if (uVar2 == 0) {
        ZSTD_CCtxParams_setZstdParams(cctxParams,(ZSTD_parameters *)local_8);
        local_8 = (ZSTD_CCtx_params *)ZSTD_CCtx_loadDictionary(cctx,dict_00,0x2a9985);
        uVar2 = ERR_isError((size_t)local_8);
        if (uVar2 == 0) {
          local_8 = (ZSTD_CCtx_params *)0x0;
        }
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pss)
{
    /* for compatibility with older programs relying on this behavior.
     * Users should now specify ZSTD_CONTENTSIZE_UNKNOWN.
     * This line will be removed in the future.
     */
    U64 const pledgedSrcSize = (pss==0 && params.fParams.contentSizeFlag==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) , "");
    ZSTD_CCtxParams_setZstdParams(&zcs->requestedParams, &params);
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    return 0;
}